

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PropertyDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PropertyDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>&,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *args_5,
          PropertySpecSyntax *args_6,Token *args_7,Token *args_8,NamedBlockClauseSyntax **args_9)

{
  Token name;
  Token keyword;
  Token semi;
  Token optionalSemi;
  Token end;
  PropertyDeclarationSyntax *pPVar1;
  Info *in_RCX;
  NamedBlockClauseSyntax *in_RDX;
  undefined8 in_R8;
  Info *in_R9;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  BumpAllocator *in_stack_ffffffffffffff28;
  
  pPVar1 = (PropertyDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  keyword.info = (Info *)*in_stack_00000018;
  keyword._0_8_ = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000020[1];
  name.info = (Info *)*in_stack_00000020;
  name._0_8_ = pPVar1;
  semi.info = (Info *)in_RCX->rawTextPtr;
  semi._0_8_ = in_R9->location;
  optionalSemi.info = in_R9;
  optionalSemi._0_8_ = (in_RDX->super_SyntaxNode).parent;
  end.info = in_RCX;
  end.kind = (short)in_R8;
  end._2_1_ = (char)((ulong)in_R8 >> 0x10);
  end.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  end.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::PropertyDeclarationSyntax::PropertyDeclarationSyntax
            ((PropertyDeclarationSyntax *)*in_stack_00000028,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000020[1],keyword,name
             ,(AssertionItemPortListSyntax *)in_R9->rawTextPtr,semi,
             (SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)in_RCX->location,
             *(PropertySpecSyntax **)&in_RDX->super_SyntaxNode,optionalSemi,end,in_RDX);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }